

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void sort_actions(void)

{
  int iVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  pYVar4 = (Yshort *)allocate(nvectors << 2);
  pYVar3 = width;
  pYVar2 = tally;
  nentries = 0;
  lVar5 = (long)nvectors;
  order = pYVar4;
  if (0 < lVar5) {
    uVar6 = 0;
    lVar8 = 0;
    do {
      iVar1 = pYVar2[lVar8];
      if (0 < iVar1) {
        uVar13 = (ulong)uVar6;
        uVar7 = (int)uVar6 >> 0x1f & uVar6;
        uVar10 = (ulong)uVar6;
        do {
          uVar13 = uVar13 - 1;
          uVar12 = (uint)uVar10;
          if ((int)uVar12 < 1) {
            uVar10 = (ulong)(uVar7 - 1);
            uVar12 = uVar7;
            break;
          }
          uVar10 = (ulong)(uVar12 - 1);
        } while (pYVar3[pYVar4[uVar13 & 0xffffffff]] < pYVar3[lVar8]);
        uVar9 = (uint)uVar10;
        uVar7 = uVar9;
        if (0 < (int)uVar12) {
          do {
            uVar12 = (uint)uVar10;
            uVar7 = uVar12;
            if ((pYVar3[pYVar4[uVar10]] != pYVar3[lVar8]) || (iVar1 <= pYVar2[pYVar4[uVar10]]))
            break;
            uVar10 = (ulong)(uVar12 - 1);
            uVar7 = ((int)uVar9 >> 0x1f & uVar9) - 1;
          } while (0 < (int)uVar12);
        }
        if ((int)uVar7 < (int)(uVar6 - 1)) {
          lVar11 = (long)(int)(uVar6 - 1);
          uVar12 = uVar6;
          do {
            pYVar4[(int)uVar12] = pYVar4[lVar11];
            lVar11 = lVar11 + -1;
            uVar12 = uVar12 - 1;
          } while ((int)uVar7 < lVar11);
        }
        pYVar4[(long)(int)uVar7 + 1] = (Yshort)lVar8;
        uVar6 = uVar6 + 1;
        nentries = uVar6;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar5);
  }
  return;
}

Assistant:

void sort_actions()
{
  register int i;
  register int j;
  register int k;
  register int t;
  register int w;

  order = NEW2(nvectors, Yshort);
  nentries = 0;

  for (i = 0; i < nvectors; i++)
    {
      if (tally[i] > 0)
	{
	  t = tally[i];
	  w = width[i];
	  j = nentries - 1;

	  while (j >= 0 && (width[order[j]] < w))
	    j--;

	  while (j >= 0 && (width[order[j]] == w) && (tally[order[j]] < t))
	    j--;

	  for (k = nentries - 1; k > j; k--)
	    order[k + 1] = order[k];

	  order[j + 1] = i;
	  nentries++;
	}
    }
}